

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O3

void __thiscall trieste::wf::Sequence::gen(Sequence *this,Gen *g,size_t depth,Node *node)

{
  result_type rVar1;
  ulong uVar2;
  Node local_50;
  Node local_40;
  
  if (this->minlen != 0) {
    uVar2 = 0;
    do {
      local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Choice::gen(&this->choice,g,depth,&local_40);
      if (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->minlen);
  }
  rVar1 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::operator()
                    (&g->rand);
  if ((rVar1 & 1) != 0) {
    do {
      local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Choice::gen(&this->choice,g,depth,&local_50);
      if (local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      rVar1 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::
              operator()(&g->rand);
    } while ((rVar1 & 1) != 0);
  }
  return;
}

Assistant:

void gen(Gen& g, size_t depth, Node node) const
      {
        for (size_t i = 0; i < minlen; ++i)
          choice.gen(g, depth, node);

        while (g.next() % 2)
          choice.gen(g, depth, node);
      }